

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Generators::Generators<arg_res_tuple<float,_2UL>_>::populate
          (Generators<arg_res_tuple<float,_2UL>_> *this,arg_res_tuple<float,_2UL> *val)

{
  IGenerator<arg_res_tuple<float,_2UL>_> *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_2UL>_>_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  value<arg_res_tuple<float,2ul>>((Generators *)&local_18,val);
  std::
  vector<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,2ul>>,std::allocator<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,2ul>>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,2ul>>>
            ((vector<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,2ul>>,std::allocator<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,2ul>>>>
              *)&this->m_generators,(GeneratorWrapper<arg_res_tuple<float,_2UL>_> *)&local_18);
  if (local_18._M_head_impl != (IGenerator<arg_res_tuple<float,_2UL>_> *)0x0) {
    (*((local_18._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }